

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O2

void __thiscall spvtools::val::Function::ComputeAugmentedCFG(Function *this)

{
  undefined8 in_stack_ffffffffffffffb0;
  undefined8 local_28;
  undefined8 uStack_20;
  code *local_18;
  code *local_10;
  
  local_28 = 0;
  uStack_20 = 0;
  local_10 = std::
             _Function_handler<const_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_*(const_spvtools::val::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/function.cpp:290:20)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<const_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_*(const_spvtools::val::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/function.cpp:290:20)>
             ::_M_manager;
  CFA<spvtools::val::BasicBlock>::ComputeAugmentedCFG
            (&this->ordered_blocks_,&this->pseudo_entry_block_,&this->pseudo_exit_block_,
             &this->augmented_successors_map_,&this->augmented_predecessors_map_,
             (get_blocks_func *)&stack0xffffffffffffffb8,
             (get_blocks_func)ZEXT1632(CONCAT88(in_stack_ffffffffffffffb0,&local_28)));
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,3);
  }
  std::
  _Function_handler<const_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_*(const_spvtools::val::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/function.cpp:287:20)>
  ::_M_manager((_Any_data *)&stack0xffffffffffffffb8,(_Any_data *)&stack0xffffffffffffffb8,
               __destroy_functor);
  return;
}

Assistant:

void Function::ComputeAugmentedCFG() {
  // Compute the successors of the pseudo-entry block, and
  // the predecessors of the pseudo exit block.
  auto succ_func = [](const BasicBlock* b) {
    return b->structural_successors();
  };
  auto pred_func = [](const BasicBlock* b) {
    return b->structural_predecessors();
  };
  CFA<BasicBlock>::ComputeAugmentedCFG(
      ordered_blocks_, &pseudo_entry_block_, &pseudo_exit_block_,
      &augmented_successors_map_, &augmented_predecessors_map_, succ_func,
      pred_func);
}